

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otsshihua_test.cc
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  OtsShihuaInsertInstanceRequestType *this;
  HttpTestListener *pHVar2;
  undefined8 extraout_RAX;
  OtsShihuaGetInstanceRequestType req_1;
  OtsShihuaListInstanceResponseType resp_3;
  OtsShihuaDeleteInstanceRequestType req;
  OtsShihuaDeleteInstanceResponseType resp;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined8 local_118;
  _Alloc_hider local_110;
  undefined7 local_108;
  undefined1 uStack_101;
  undefined1 auStack_100 [8];
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_50;
  
  local_b8._8_8_ = 0;
  local_a8._M_local_buf[0] = '\0';
  pcVar1 = local_158 + 0x10;
  local_158[0x10] = 'c';
  local_158._17_6_ = 0x676e61682d6e;
  local_158[0x17] = 'z';
  local_158[0x18] = 'h';
  local_158._25_2_ = 0x756f;
  local_158._8_8_ = 0xb;
  local_158[0x1b] = '\0';
  local_108 = 0x697070615f796d;
  uStack_101 = 100;
  local_110._M_p = (pointer)0x8;
  auStack_100[0] = '\0';
  local_c8._M_allocated_capacity._0_7_ = 0x726365735f796d;
  local_c8._M_local_buf[7] = 'e';
  local_c8._M_local_buf[8] = 't';
  local_d8._8_8_ = 9;
  local_c8._M_local_buf[9] = '\0';
  local_158._0_8_ = pcVar1;
  local_118 = &local_108;
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  local_b8._M_allocated_capacity = (size_type)&local_a8;
  this = (OtsShihuaInsertInstanceRequestType *)
         aliyun::OtsShihua::CreateOtsShihuaClient(local_158,&local_118,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_allocated_capacity != &local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,
                    CONCAT17(local_c8._M_local_buf[7],local_c8._M_allocated_capacity._0_7_) + 1);
  }
  if ((undefined7 *)local_118 != &local_108) {
    operator_delete((void *)local_118,CONCAT17(uStack_101,local_108) + 1);
  }
  if ((pointer)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_,
                    CONCAT17(local_158[0x17],CONCAT61(local_158._17_6_,local_158[0x10])) + 1);
  }
  if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT17(local_a8._M_local_buf[7],
                               CONCAT61(local_a8._M_allocated_capacity._1_6_,
                                        local_a8._M_local_buf[0])) + 1);
    }
    local_158._8_8_ = 0;
    local_158[0x10] = '\0';
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_88._M_allocated_capacity = 0;
    local_88._M_local_buf[8] = '\0';
    local_68._M_allocated_capacity = 0;
    local_68._M_local_buf[8] = '\0';
    local_108 = 0x676e61682d6e63;
    uStack_101 = 0x7a;
    auStack_100[0] = 'h';
    auStack_100[1] = 'o';
    auStack_100[2] = 'u';
    local_110._M_p = (pointer)0xb;
    auStack_100[3] = '\0';
    local_c8._M_allocated_capacity._0_7_ = 0x697070615f796d;
    local_c8._M_local_buf[7] = 'd';
    local_d8._8_8_ = 8;
    local_c8._M_local_buf[8] = '\0';
    local_138._16_7_ = 0x726365735f796d;
    local_138[0x17] = 'e';
    local_138[0x18] = 't';
    local_138._8_8_ = (pointer)0x9;
    local_138[0x19] = '\0';
    local_158._0_8_ = pcVar1;
    local_138._0_8_ = local_138 + 0x10;
    local_118 = &local_108;
    local_d8._M_allocated_capacity = (size_type)&local_c8;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_90 = local_88._M_local_buf + 8;
    local_70 = local_68._M_local_buf + 8;
    this = (OtsShihuaInsertInstanceRequestType *)
           aliyun::OtsShihua::CreateOtsShihuaClient(&local_118,&local_d8,local_138);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,CONCAT17(local_138[0x17],local_138._16_7_) + 1);
    }
    pcVar1 = local_158 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_allocated_capacity != &local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,
                      CONCAT17(local_c8._M_local_buf[7],local_c8._M_allocated_capacity._0_7_) + 1);
    }
    if ((undefined7 *)local_118 != &local_108) {
      operator_delete((void *)local_118,CONCAT17(uStack_101,local_108) + 1);
    }
    if (this != (OtsShihuaInsertInstanceRequestType *)0x0) goto LAB_00104b16;
    if (local_70 != local_68._M_local_buf + 8) {
      operator_delete(local_70,CONCAT71(local_68._9_7_,local_68._M_local_buf[8]) + 1);
    }
    if (local_90 != local_88._M_local_buf + 8) {
      operator_delete(local_90,CONCAT71(local_88._9_7_,local_88._M_local_buf[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity != &local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity,
                      CONCAT17(local_a8._M_local_buf[7],
                               CONCAT61(local_a8._M_allocated_capacity._1_6_,
                                        local_a8._M_local_buf[0])) + 1);
    }
    if ((pointer)local_158._0_8_ != pcVar1) {
      operator_delete((void *)local_158._0_8_,
                      CONCAT17(local_158[0x17],CONCAT61(local_158._17_6_,local_158[0x10])) + 1);
    }
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    local_90 = (char *)0x0;
    local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
    local_70 = (char *)0x0;
    local_68._M_allocated_capacity = local_68._M_allocated_capacity & 0xffffffffffffff00;
    local_158[0x10] = 'c';
    local_158._17_6_ = 0x676e61682d6e;
    local_158[0x17] = 'z';
    local_158[0x18] = 'h';
    local_158._25_2_ = 0x756f;
    local_158._8_8_ = 0xb;
    local_158[0x1b] = '\0';
    local_108 = 0x697070615f796d;
    uStack_101 = 100;
    local_110._M_p = (pointer)0x8;
    auStack_100[0] = '\0';
    local_c8._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_c8._M_local_buf[7] = 'e';
    local_c8._M_local_buf[8] = 't';
    local_d8._8_8_ = 9;
    local_c8._M_local_buf[9] = '\0';
    local_158._0_8_ = pcVar1;
    local_118 = &local_108;
    local_d8._M_allocated_capacity = (size_type)&local_c8;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    local_98 = &local_88;
    local_78 = &local_68;
    this = (OtsShihuaInsertInstanceRequestType *)aliyun::OtsShihua::CreateOtsShihuaClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_allocated_capacity != &local_c8) {
      operator_delete((void *)local_d8._M_allocated_capacity,
                      CONCAT17(local_c8._M_local_buf[7],local_c8._M_allocated_capacity._0_7_) + 1);
    }
    if ((undefined7 *)local_118 != &local_108) {
      operator_delete((void *)local_118,CONCAT17(uStack_101,local_108) + 1);
    }
    if ((pointer)local_158._0_8_ != pcVar1) {
      operator_delete((void *)local_158._0_8_,
                      CONCAT17(local_158[0x17],CONCAT61(local_158._17_6_,local_158[0x10])) + 1);
    }
    if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68._M_allocated_capacity + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_allocated_capacity != &local_a8) {
        operator_delete((void *)local_b8._M_allocated_capacity,
                        CONCAT17(local_a8._M_local_buf[7],
                                 CONCAT61(local_a8._M_allocated_capacity._1_6_,
                                          local_a8._M_local_buf[0])) + 1);
      }
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity._0_2_ = 0;
      local_f8.field_2._M_local_buf[2] = '\0';
      local_f8.field_2._M_allocated_capacity._3_4_ = 0;
      local_f8.field_2._M_local_buf[7] = '\0';
      local_a8._M_local_buf[0] = 'c';
      local_a8._M_allocated_capacity._1_6_ = 0x676e61682d6e;
      local_a8._7_4_ = 0x756f687a;
      local_b8._8_8_ = 0xb;
      local_a8._M_local_buf[0xb] = '\0';
      local_158[0x10] = 'm';
      local_158._17_6_ = 0x697070615f79;
      local_158[0x17] = 'd';
      local_158._8_8_ = 8;
      local_158[0x18] = '\0';
      local_108 = 0x726365735f796d;
      uStack_101 = 0x65;
      auStack_100[0] = 't';
      local_110._M_p = (pointer)0x9;
      auStack_100[1] = '\0';
      local_158._0_8_ = pcVar1;
      local_118 = &local_108;
      local_b8._M_allocated_capacity = (size_type)&local_a8;
      this = (OtsShihuaInsertInstanceRequestType *)aliyun::OtsShihua::CreateOtsShihuaClient();
      if ((undefined7 *)local_118 != &local_108) {
        operator_delete((void *)local_118,CONCAT17(uStack_101,local_108) + 1);
      }
      if ((pointer)local_158._0_8_ != pcVar1) {
        operator_delete((void *)local_158._0_8_,
                        CONCAT17(local_158[0x17],CONCAT61(local_158._17_6_,local_158[0x10])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_allocated_capacity != &local_a8) {
        operator_delete((void *)local_b8._M_allocated_capacity,
                        CONCAT17(local_a8._M_local_buf[7],
                                 CONCAT61(local_a8._M_allocated_capacity._1_6_,
                                          local_a8._M_local_buf[0])) + 1);
      }
      if (this == (OtsShihuaInsertInstanceRequestType *)0x0) {
        std::
        vector<aliyun::OtsShihuaListInstanceInstanceInfoType,_std::allocator<aliyun::OtsShihuaListInstanceInstanceInfoType>_>
        ::~vector((vector<aliyun::OtsShihuaListInstanceInstanceInfoType,_std::allocator<aliyun::OtsShihuaListInstanceInstanceInfoType>_>
                   *)(auStack_100 + 8));
        return 0;
      }
      goto LAB_00104d54;
    }
  }
  else {
    local_138._16_7_ = 0x302e302e373231;
    local_138[0x17] = '.';
    local_138[0x18] = '1';
    local_138[0x19] = ':';
    local_138._26_5_ = 0x3433323231;
    local_138._8_8_ = (pointer)0xf;
    local_138[0x1f] = '\0';
    local_138._0_8_ = local_138 + 0x10;
    aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,(string *)local_138);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,CONCAT17(local_138[0x17],local_138._16_7_) + 1);
    }
    if ((char)(this->cluster_type)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_f8._M_string_length = 2;
    local_f8.field_2._M_local_buf[2] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,(string *)(auStack_100 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT17(local_f8.field_2._M_local_buf[7],
                               CONCAT43(local_f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_f8.field_2._M_local_buf[2],
                                                 local_f8.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"InstanceName");
    aliyun::OtsShihua::DeleteInstance
              ((OtsShihuaDeleteInstanceRequestType *)this,
               (OtsShihuaDeleteInstanceResponseType *)local_b8._M_local_buf,
               (OtsShihuaErrorInfo *)&local_50);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_1();
LAB_00104b16:
    local_f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_f8.field_2._M_local_buf[2] = '7';
    local_f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_f8.field_2._M_local_buf[7] = '.';
    local_f8.field_2._8_7_ = 0x34333232313a31;
    local_f8._M_string_length = 0xf;
    local_f8.field_2._M_local_buf[0xf] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,(string *)(auStack_100 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT17(local_f8.field_2._M_local_buf[7],
                               CONCAT43(local_f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_f8.field_2._M_local_buf[2],
                                                 local_f8.field_2._M_allocated_capacity._0_2_))) + 1
                     );
    }
    if ((char)(this->cluster_type)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "{  \"InstanceInfo\": {    \"InstanceName\": \"InstanceName\",    \"Status\": 0,    \"Description\": \"Description\",    \"Timestamp\": \"Timestamp\"  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_158,"InstanceName");
    aliyun::OtsShihua::GetInstance
              ((OtsShihuaGetInstanceRequestType *)this,(OtsShihuaGetInstanceResponseType *)local_158
               ,(OtsShihuaErrorInfo *)local_b8._M_local_buf);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_2();
  }
  local_138._16_7_ = 0x302e302e373231;
  local_138[0x17] = '.';
  local_138[0x18] = '1';
  local_138[0x19] = ':';
  local_138._26_5_ = 0x3433323231;
  local_138._8_8_ = (pointer)0xf;
  local_138[0x1f] = '\0';
  local_138._0_8_ = local_138 + 0x10;
  aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,(string *)local_138);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,CONCAT17(local_138[0x17],local_138._16_7_) + 1);
  }
  if ((char)(this->cluster_type)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_f8._M_string_length = 2;
  local_f8.field_2._M_local_buf[2] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  HttpTestListener::SetResponseBody(pHVar2,(string *)(auStack_100 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT17(local_f8.field_2._M_local_buf[7],
                             CONCAT43(local_f8.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_f8.field_2._M_local_buf[2],
                                               local_f8.field_2._M_allocated_capacity._0_2_))) + 1);
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)local_b8._M_local_buf,"InstanceName");
  std::__cxx11::string::operator=((string *)&local_98,"ClusterType");
  std::__cxx11::string::operator=((string *)&local_78,"Description");
  aliyun::OtsShihua::InsertInstance
            (this,(OtsShihuaInsertInstanceResponseType *)local_b8._M_local_buf,
             (OtsShihuaErrorInfo *)&local_50);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_3();
LAB_00104d54:
  local_c8._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_c8._M_local_buf[7] = '.';
  local_c8._M_local_buf[8] = '1';
  local_c8._M_local_buf[9] = ':';
  local_c8._10_5_ = 0x3433323231;
  local_d8._8_8_ = 0xf;
  local_c8._M_local_buf[0xf] = '\0';
  local_d8._M_allocated_capacity = (size_type)&local_c8;
  aliyun::OtsShihua::SetProxyHost((OtsShihua *)this,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_allocated_capacity != &local_c8) {
    operator_delete((void *)local_d8._M_allocated_capacity,
                    CONCAT17(local_c8._M_local_buf[7],local_c8._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->cluster_type)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->cluster_type)._M_string_length + 1) = 0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,
             "{  \"InstanceInfos\": {    \"InstanceInfo\": [      {        \"InstanceName\": \"InstanceName\",        \"Timestamp\": \"Timestamp\"      }    ]  }}"
             ,"");
  HttpTestListener::SetResponseBody(pHVar2,(string *)local_138);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,CONCAT17(local_138[0x17],local_138._16_7_) + 1);
  }
  HttpTestListener::Start(pHVar2);
  aliyun::OtsShihua::ListInstance
            ((OtsShihuaListInstanceResponseType *)this,(OtsShihuaErrorInfo *)(auStack_100 + 8));
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_4();
  aliyun::OtsShihuaInsertInstanceRequestType::~OtsShihuaInsertInstanceRequestType
            ((OtsShihuaInsertInstanceRequestType *)&local_b8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_delete_instance();
  test_get_instance();
  test_insert_instance();
  test_list_instance();
}